

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpSetDegree_Hermite(ARKodeMem_conflict ark_mem,ARKInterp interp,int degree)

{
  int in_EDX;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  int local_4;
  
  if ((in_EDX < 6) && (-1 < in_EDX)) {
    *(int *)*in_RSI = in_EDX;
    local_4 = 0;
  }
  else {
    arkProcessError(in_RDI,-0x28,0x133,"arkInterpSetDegree_Hermite",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_interp.c"
                    ,"Illegal degree specified.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkInterpSetDegree_Hermite(ARKodeMem ark_mem, ARKInterp interp, int degree)
{
  if (degree > ARK_INTERP_MAX_DEGREE || degree < 0)
  {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "Illegal degree specified.");
    return ARK_ILL_INPUT;
  }

  HINT_DEGREE(interp) = degree;

  return ARK_SUCCESS;
}